

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

void player_quests_reset(player *p)

{
  quest *pqVar1;
  quest *pqVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  if (p->quests != (quest *)0x0) {
    player_quests_free(p);
  }
  pqVar2 = (quest *)mem_zalloc((ulong)z_info->quest_max * 0x30);
  p->quests = pqVar2;
  if (z_info->quest_max != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pcVar3 = string_make(*(char **)((long)&quests->name + lVar5));
      pqVar2 = p->quests;
      *(char **)((long)&pqVar2->name + lVar5) = pcVar3;
      pqVar1 = quests;
      (&pqVar2->level)[lVar5] = (&quests->level)[lVar5];
      *(undefined8 *)((long)&pqVar2->race + lVar5) = *(undefined8 *)((long)&pqVar1->race + lVar5);
      *(undefined4 *)((long)&pqVar2->max_num + lVar5) =
           *(undefined4 *)((long)&quests->max_num + lVar5);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x30;
    } while (uVar4 < z_info->quest_max);
  }
  return;
}

Assistant:

void player_quests_reset(struct player *p)
{
	size_t i;

	if (p->quests)
		player_quests_free(p);
	p->quests = mem_zalloc(z_info->quest_max * sizeof(struct quest));

	for (i = 0; i < z_info->quest_max; i++) {
		p->quests[i].name = string_make(quests[i].name);
		p->quests[i].level = quests[i].level;
		p->quests[i].race = quests[i].race;
		p->quests[i].max_num = quests[i].max_num;
	}
}